

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O3

vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> *
bijectiveParameterization
          (vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
           *__return_storage_ptr__,Mesh *mesh,double error)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> *pvVar4;
  double *pdVar5;
  long lVar6;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  DenseStorage<double,__1,__1,_1,_0> local_88;
  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> *local_78;
  DenseStorage<double,__1,__1,_1,_0> local_70;
  undefined8 local_60;
  double *local_58;
  Index IStack_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  local_78 = __return_storage_ptr__;
  init((EVP_PKEY_CTX *)&local_48);
  lVar9 = (long)local_40 - (long)local_48 >> 3;
  uVar10 = (long)local_40 - (long)local_48 >> 2;
  local_88.m_data = (double *)0x0;
  local_88.m_rows = 0;
  if ((long)local_40 - (long)local_48 != 0) {
    if ((uVar10 >> 0x3d != 0) ||
       (pdVar5 = (double *)malloc(((long)local_40 - (long)local_48) * 2), pdVar5 == (double *)0x0))
    {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = std::streambuf::xsgetn;
      __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    lVar6 = lVar9 + (ulong)(lVar9 == 0);
    lVar8 = 0;
    do {
      uVar1 = *(undefined8 *)((long)(local_48->values_)._M_elems + lVar8);
      dVar3 = (double)(float)((ulong)uVar1 >> 0x20);
      auVar2._8_4_ = SUB84(dVar3,0);
      auVar2._0_8_ = (double)(float)uVar1;
      auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
      *(undefined1 (*) [16])((long)pdVar5 + lVar8 * 2) = auVar2;
      lVar8 = lVar8 + 8;
      lVar6 = lVar6 + -1;
      local_88.m_data = pdVar5;
    } while (lVar6 != 0);
  }
  local_88.m_rows = uVar10;
  getAveLen(mesh,(VectorXd *)&local_88);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_70,&local_88);
  local_60 = 0x3f40624dd2f1a9fc;
  LBFGS((Mesh *)&local_58,(VectorXd *)mesh,(double *)&local_70);
  pdVar5 = local_88.m_data;
  local_88.m_data = local_58;
  local_88.m_rows = IStack_50;
  free(pdVar5);
  free(local_70.m_data);
  pvVar4 = local_78;
  if (local_40 != local_48) {
    lVar6 = 0;
    pdVar5 = local_88.m_data;
    do {
      *(ulong *)local_48[lVar6].values_._M_elems = CONCAT44((float)pdVar5[1],(float)*pdVar5);
      lVar6 = lVar6 + 1;
      pdVar5 = pdVar5 + 2;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar6);
  }
  (local_78->
  super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>).
  _M_impl.super__Vector_impl_data._M_start = local_48;
  (local_78->
  super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = local_40;
  (local_78->
  super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_38;
  free(local_88.m_data);
  return pvVar4;
}

Assistant:

std::vector<OpenMesh::Vec2f> bijectiveParameterization(Mesh& mesh, double error) {
    auto init_param = init(mesh); // the initial parameterization for the mesh
    Eigen::VectorXd x(init_param.size() * 2);
    for (int i = 0; i < init_param.size(); ++i) {
        x[2 * i] = init_param[i][0];
        x[2 * i + 1] = init_param[i][1];
    }

    auto epsilon = getAveLen(mesh, x) * 0.25;
    // std::cerr << checkCreterion(mesh, x, epsilon) << std::endl;
    x = LBFGS(mesh, x, 0.0005); // optimize the parameterization using Quasi Newton Method

    // copy the result into a vector
    for (int i = 0; i < init_param.size(); ++i) {
        init_param[i][0] = x[2 * i];
        init_param[i][1] = x[2 * i + 1];
    }

    return std::move(init_param);
}